

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idxset.cpp
# Opt level: O2

int __thiscall soplex::IdxSet::remove(IdxSet *this,char *__filename)

{
  int *piVar1;
  int iVar2;
  int in_EDX;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar2 = this->num;
  iVar4 = iVar2 - (in_EDX + 1);
  iVar3 = (in_EDX + 1) - (int)__filename;
  piVar1 = this->idx;
  if (iVar3 <= iVar4) {
    iVar4 = iVar3;
  }
  lVar5 = (long)iVar4 + 1;
  do {
    iVar4 = this->num;
    this->num = iVar4 + -1;
    piVar1[(long)(int)__filename + lVar5 + -2] = piVar1[(long)iVar4 + -1];
    lVar5 = lVar5 + -1;
  } while (1 < lVar5);
  iVar2 = iVar2 - iVar3;
  this->num = iVar2;
  return iVar2;
}

Assistant:

void IdxSet::remove(int n, int m)
{
   assert(n <= m && m < size() && n >= 0);
   ++m;

   int cpy = m - n;
   int newnum = num - cpy;
   cpy = (size() - m >= cpy) ? cpy : size() - m;

   do
   {
      --num;
      --cpy;
      idx[n + cpy] = idx[num];
   }
   while(cpy > 0);

   num = newnum;
}